

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O1

cio_error cio_eventloop_init(cio_eventloop *loop)

{
  cio_event_notifier *evn;
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  uint events;
  
  loop->event_counter = 0;
  loop->num_events = 0;
  loop->current_ev = (cio_event_notifier *)0x0;
  iVar1 = epoll_create1(0x80000);
  loop->epoll_fd = iVar1;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    cVar2 = -*piVar3;
  }
  else {
    iVar1 = eventfd(0,0x800);
    (loop->stop_ev).fd = iVar1;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      cVar2 = -*piVar3;
    }
    else {
      evn = &loop->stop_ev;
      cVar2 = cio_linux_eventloop_add(loop,evn);
      if (cVar2 == CIO_SUCCESS) {
        events = (loop->stop_ev).registered_events | 1;
        (loop->stop_ev).registered_events = events;
        cVar2 = epoll_mod(loop,evn,events);
        if (cVar2 == CIO_SUCCESS) {
          return CIO_SUCCESS;
        }
        cio_linux_eventloop_remove(loop,evn);
      }
      close((loop->stop_ev).fd);
    }
    close(loop->epoll_fd);
  }
  return cVar2;
}

Assistant:

enum cio_error cio_eventloop_init(struct cio_eventloop *loop)
{
	enum cio_error err = CIO_SUCCESS;

	loop->num_events = 0;
	loop->event_counter = 0;
	loop->current_ev = NULL;

	loop->epoll_fd = epoll_create1(EPOLL_CLOEXEC);
	if (cio_unlikely(loop->epoll_fd == -1)) {
		return (enum cio_error)(-errno);
	}

	loop->stop_ev.fd = eventfd(0, EFD_NONBLOCK);
	if (cio_unlikely(loop->stop_ev.fd == -1)) {
		err = (enum cio_error)(-errno);
		goto eventfd_failed;
	}

	err = cio_linux_eventloop_add(loop, &loop->stop_ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto ev_add_failed;
	}

	err = cio_linux_eventloop_register_read(loop, &loop->stop_ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto ev_register_read_failed;
	}

	return CIO_SUCCESS;

ev_register_read_failed:
	cio_linux_eventloop_remove(loop, &loop->stop_ev);
ev_add_failed:
	close(loop->stop_ev.fd);
eventfd_failed:
	close(loop->epoll_fd);
	return err;
}